

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.hpp
# Opt level: O2

String * Diligent::GetObjectDescString<Diligent::TextureDesc>
                   (String *__return_storage_ptr__,TextureDesc *TexDesc)

{
  TextureDesc *Desc;
  String local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Tex desc: ",(allocator *)&local_30)
  ;
  GetTextureDescString_abi_cxx11_(&local_30,(Diligent *)TexDesc,Desc);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline String GetObjectDescString(const TextureDesc& TexDesc)
{
    String Str{"Tex desc: "};
    Str += GetTextureDescString(TexDesc);
    return Str;
}